

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O2

void test_common<unsigned_long>(uint length,unsigned_long value)

{
  long lVar1;
  undefined8 *puVar2;
  _func_int ***ppp_Var3;
  ulong uVar4;
  undefined8 uVar5;
  long lVar6;
  uint i;
  unsigned_long *puVar7;
  undefined1 (*pauVar8) [16];
  undefined8 *puVar9;
  long lVar10;
  ulong uVar11;
  undefined8 *puVar12;
  int iVar13;
  int iVar14;
  undefined1 auVar15 [16];
  undefined1 (*local_58) [16];
  shared_ptr<unsigned_long> pa;
  shared_ptr<unsigned_long> pb;
  
  uVar4 = (ulong)length;
  puVar7 = sse::common::malloc<unsigned_long>(length + 1);
  std::__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2> *)&local_58,puVar7,
             sse::common::free<unsigned_long>);
  puVar7 = sse::common::malloc<unsigned_long>(length + 1);
  std::__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<unsigned_long,void(*)(unsigned_long*),void>
            ((__shared_ptr<unsigned_long,(__gnu_cxx::_Lock_policy)2> *)
             &pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount,puVar7,
             sse::common::free<unsigned_long>);
  *(undefined8 *)(*local_58 + uVar4 * 8) = 0x7f;
  (&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar4] = (_func_int **)0x3f;
  auVar15._8_4_ = (int)value;
  auVar15._0_8_ = value;
  auVar15._12_4_ = (int)(value >> 0x20);
  iVar14 = (int)length >> 1;
  pauVar8 = local_58;
  for (iVar13 = iVar14; 3 < iVar13; iVar13 = iVar13 + -4) {
    *pauVar8 = auVar15;
    pauVar8[1] = auVar15;
    pauVar8[2] = auVar15;
    pauVar8[3] = auVar15;
    pauVar8 = pauVar8 + 4;
  }
  if (1 < iVar13) {
    *pauVar8 = auVar15;
    pauVar8[1] = auVar15;
    iVar13 = iVar13 + -2;
    pauVar8 = pauVar8 + 2;
  }
  if (iVar13 != 0) {
    *pauVar8 = auVar15;
  }
  pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(long)(int)length;
  if (length != 0) {
    *(unsigned_long *)
     (local_58[-1] +
     (long)pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi * 8 +
     8) = value;
  }
  uVar11 = 0;
  while (uVar4 != uVar11) {
    lVar10 = uVar11 * 8;
    uVar11 = uVar11 + 1;
    if (*(unsigned_long *)(*local_58 + lVar10) != value) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = unsigned long]";
      *(undefined4 *)(puVar9 + 1) = 0x16;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  lVar10 = 0;
  for (iVar13 = iVar14; 3 < iVar13; iVar13 = iVar13 + -4) {
    uVar5 = *(undefined8 *)((long)(*local_58 + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(*local_58 + lVar10);
    puVar9[1] = uVar5;
    uVar5 = *(undefined8 *)((long)(local_58[1] + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi[1]._vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(local_58[1] + lVar10);
    puVar9[1] = uVar5;
    uVar5 = *(undefined8 *)((long)(local_58[2] + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi[2]._vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(local_58[2] + lVar10);
    puVar9[1] = uVar5;
    uVar5 = *(undefined8 *)((long)(local_58[3] + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi[3]._vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(local_58[3] + lVar10);
    puVar9[1] = uVar5;
    lVar10 = lVar10 + 0x40;
  }
  if (iVar13 < 2) {
    puVar9 = (undefined8 *)(*local_58 + lVar10);
    puVar12 = (undefined8 *)
              ((long)&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + lVar10);
  }
  else {
    puVar2 = (undefined8 *)(*local_58 + lVar10);
    puVar9 = puVar2 + 4;
    uVar5 = puVar2[1];
    puVar12 = (undefined8 *)
              ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi[2]._vptr__Sp_counted_base + lVar10);
    puVar12[-4] = *puVar2;
    puVar12[-3] = uVar5;
    uVar5 = puVar2[3];
    puVar12[-2] = puVar2[2];
    puVar12[-1] = uVar5;
    iVar13 = iVar13 + -2;
  }
  if (iVar13 != 0) {
    uVar5 = puVar9[1];
    *puVar12 = *puVar9;
    puVar12[1] = uVar5;
  }
  if (length != 0) {
    *(undefined8 *)
     ((long)pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     (long)pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi * 8 +
     -8) = *(undefined8 *)
            (local_58[-1] +
            (long)pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            * 8 + 8);
  }
  uVar11 = 0;
  while (uVar4 != uVar11) {
    ppp_Var3 = &(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_vptr__Sp_counted_base + uVar11;
    uVar11 = uVar11 + 1;
    if (*ppp_Var3 != (_func_int **)value) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = unsigned long]";
      *(undefined4 *)(puVar9 + 1) = 0x1d;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<unsigned_long>
            ((unsigned_long *)
             pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             length);
  uVar11 = 0;
  while (uVar4 != uVar11) {
    ppp_Var3 = &(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                ->_vptr__Sp_counted_base + uVar11;
    uVar11 = uVar11 + 1;
    if (*ppp_Var3 != (_func_int **)0x0) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = unsigned long]";
      *(undefined4 *)(puVar9 + 1) = 0x24;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
    *(ulong *)(*local_58 + uVar11 * 8) = uVar11;
  }
  lVar10 = 0;
  for (; 3 < iVar14; iVar14 = iVar14 + -4) {
    uVar5 = *(undefined8 *)((long)(*local_58 + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(*local_58 + lVar10);
    puVar9[1] = uVar5;
    uVar5 = *(undefined8 *)((long)(local_58[1] + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi[1]._vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(local_58[1] + lVar10);
    puVar9[1] = uVar5;
    uVar5 = *(undefined8 *)((long)(local_58[2] + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi[2]._vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(local_58[2] + lVar10);
    puVar9[1] = uVar5;
    uVar5 = *(undefined8 *)((long)(local_58[3] + lVar10) + 8);
    puVar9 = (undefined8 *)
             ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi[3]._vptr__Sp_counted_base + lVar10);
    *puVar9 = *(undefined8 *)(local_58[3] + lVar10);
    puVar9[1] = uVar5;
    lVar10 = lVar10 + 0x40;
  }
  if (iVar14 < 2) {
    puVar9 = (undefined8 *)(*local_58 + lVar10);
    puVar12 = (undefined8 *)
              ((long)&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi)->_vptr__Sp_counted_base + lVar10);
  }
  else {
    puVar2 = (undefined8 *)(*local_58 + lVar10);
    puVar9 = puVar2 + 4;
    uVar5 = puVar2[1];
    puVar12 = (undefined8 *)
              ((long)&pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi[2]._vptr__Sp_counted_base + lVar10);
    puVar12[-4] = *puVar2;
    puVar12[-3] = uVar5;
    uVar5 = puVar2[3];
    puVar12[-2] = puVar2[2];
    puVar12[-1] = uVar5;
    iVar14 = iVar14 + -2;
  }
  if (iVar14 != 0) {
    uVar5 = puVar9[1];
    *puVar12 = *puVar9;
    puVar12[1] = uVar5;
  }
  if (length != 0) {
    *(undefined8 *)
     ((long)pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
     (long)pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi * 8 +
     -8) = *(undefined8 *)
            (local_58[-1] +
            (long)pb.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            * 8 + 8);
  }
  lVar10 = -1;
  while (lVar10 - uVar4 != -1) {
    lVar1 = lVar10 + 1;
    lVar6 = lVar10 * 2;
    lVar10 = lVar1;
    if (lVar1 != *(long *)(&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi)->_M_use_count + lVar6)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = unsigned long]";
      *(undefined4 *)(puVar9 + 1) = 0x2d;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  if ((*(long *)(*local_58 + uVar4 * 8) == 0x7f) &&
     ((&(pa.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar4] == (_func_int **)0x3f)) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pb);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pa);
    return;
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar9 = "void test_common(unsigned int, T) [T = unsigned long]";
  *(undefined4 *)(puVar9 + 1) = 0x31;
  *(uint *)((long)puVar9 + 0xc) = length;
  __cxa_throw(puVar9,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}